

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  PathList_t *this;
  FILE *__stream;
  undefined8 uVar1;
  int iVar2;
  FileReaderFactory defaultFactory;
  CommandOptions Options;
  Result_t result;
  CommandOptions local_130;
  int local_100 [26];
  CommandOptions local_98 [2];
  
  Kumu::Result_t::Result_t((Result_t *)local_100,(Result_t *)Kumu::RESULT_OK);
  CommandOptions::CommandOptions(&local_130,argc,argv);
  __stream = _stdout;
  if (local_130.version_flag == true) {
    uVar1 = ASDCP::Version();
    fprintf(__stream,
            "\n%s (asdcplib %s)\n\nCopyright (c) 2003-2015 John Hurst\n\nasdcplib may be copied only under the terms of the license found at\nthe top of every file in the asdcplib distribution kit.\n\nSpecify the -h (help) option for further information about %s\n\n"
            ,"as-02-info",uVar1,"as-02-info");
  }
  if (local_130.help_flag == true) {
    fprintf(_stdout,
            "USAGE:%s [-h|-help] [-V]\n\n       %s [options] <input-file>+\n\nOptions:\n  -c          - Show essence coding UL\n  -d          - Show essence descriptor info\n  -h | -help  - Show help\n  -H          - Show MXF header metadata\n  -i          - Show identity info\n  -n          - Show index\n  -r          - Show bit-rate (Mb/s)\n  -t <int>    - Set high-bitrate threshold (Mb/s)\n  -V          - Show version information\n\n  NOTES: o There is no option grouping, all options must be distinct arguments.\n         o All option arguments must be separated from the option by whitespace.\n\n"
            ,"as-02-info");
  }
  iVar2 = 0;
  if ((local_130.version_flag == false) && (iVar2 = 0, local_130.help_flag == false)) {
    if (local_130.error_flag == true) {
      main_cold_2();
      iVar2 = 3;
    }
    else {
      init_rate_info();
      this = &local_130.filenames;
      if (local_130.filenames.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this) {
        do {
          if (local_100[0] < 0) goto LAB_0010b076;
          show_file_info(local_98,(IFileReaderFactory *)&local_130);
          Kumu::Result_t::operator=((Result_t *)local_100,(Result_t *)local_98);
          Kumu::Result_t::~Result_t((Result_t *)local_98);
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(this,(iterator)
                          local_130.filenames.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next);
        } while (local_130.filenames.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this);
      }
      iVar2 = 0;
      if (local_100[0] < 0) {
LAB_0010b076:
        main_cold_1();
        iVar2 = local_98[0]._0_4_;
      }
    }
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_130.filenames.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  Kumu::Result_t::~Result_t((Result_t *)local_100);
  return iVar2;
}

Assistant:

int
main(int argc, const char** argv)
{
  Result_t result = RESULT_OK;
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  init_rate_info();
  Kumu::FileReaderFactory defaultFactory;
  while ( ! Options.filenames.empty() && ASDCP_SUCCESS(result) )
    {
      result = show_file_info(Options, defaultFactory);
      Options.filenames.pop_front();
    }

  if ( ASDCP_FAILURE(result) )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}